

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_simplex_raw<std::vector<int,std::allocator<int>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vector<int,_std::allocator<int>_> *simplex,Filtration_value *filtration)

{
  undefined8 *puVar1;
  Vertex_handle v;
  uint uVar2;
  pointer *ppiVar3;
  ulong uVar4;
  uint *puVar5;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  pVar6;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar7;
  __buckets_ptr local_40;
  char local_38;
  
  ppiVar3 = &simplex[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  v = (Vertex_handle)ppiVar3;
  puVar5 = (uint *)*filtration;
  if (puVar5 != (uint *)((long)filtration[1] + -4)) {
    do {
      if (*puVar5 ==
          *(uint *)&simplex[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) goto LAB_00118f40;
      insert_node_<false,true,false,double_const&>
                ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0,
                 (Siblings *)simplex,(Vertex_handle)ppiVar3,(double *)(ulong)*puVar5);
      ppiVar3 = (pointer *)local_40[3];
      v = (Vertex_handle)ppiVar3;
      puVar5 = puVar5 + 1;
    } while (puVar5 != (uint *)((long)filtration[1] + -4));
  }
  if (*puVar5 !=
      *(uint *)&simplex[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pVar6 = insert_node_<true,false,true,double_const&>
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0
                       ,(Siblings *)simplex,v,(double *)(ulong)*puVar5);
    uVar4 = pVar6._8_8_;
    if (local_38 == '\x01') {
      uVar2 = (int)((ulong)((long)filtration[1] - (long)*filtration) >> 2) - 1;
      uVar4 = (ulong)uVar2;
      if (*(int *)&simplex[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish < (int)uVar2) {
        *(uint *)&simplex[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = uVar2;
      }
    }
    (this->nodes_label_to_list_)._M_h._M_buckets = local_40;
    *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_38;
    pVar7._8_8_ = uVar4;
    pVar7.first.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)this;
    return pVar7;
  }
LAB_00118f40:
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }